

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_bignum_mul(sexp ctx,sexp dst,sexp a,sexp b)

{
  sexp_uint_t sVar1;
  sexp_uint_t sVar2;
  sexp psVar3;
  ulong k;
  sexp z0;
  sexp b1;
  sexp a1;
  sexp a0;
  sexp z2;
  sexp b0;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_e8;
  sexp local_e0;
  sexp local_d8;
  sexp local_d0;
  sexp local_c8;
  sexp local_c0;
  sexp local_b8;
  ulong local_b0;
  sexp_conflict *local_a8;
  sexp_gc_var_t *psStack_a0;
  sexp_conflict *local_98;
  sexp_conflict **pppsStack_90;
  sexp_conflict *local_88;
  sexp_conflict **pppsStack_80;
  sexp_gc_var_t local_70;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp *local_40;
  sexp_conflict **local_38;
  
  sVar1 = sexp_bignum_hi(a);
  sVar2 = sexp_bignum_hi(b);
  local_d0 = (sexp)&DAT_0000043e;
  local_a8 = (sexp_conflict *)0x0;
  psStack_a0 = (sexp_gc_var_t *)0x0;
  local_d8 = (sexp)&DAT_0000043e;
  local_88 = (sexp_conflict *)0x0;
  pppsStack_80 = (sexp_conflict **)0x0;
  local_b8 = (sexp)&DAT_0000043e;
  local_98 = (sexp_conflict *)0x0;
  pppsStack_90 = (sexp_conflict **)0x0;
  local_e0 = (sexp)&DAT_0000043e;
  local_e8 = (sexp)0x43e;
  local_c0 = (sexp)0x43e;
  local_c8 = (sexp)0x43e;
  if (sVar1 < sVar2) {
    psVar3 = sexp_bignum_mul(ctx,dst,b,a);
    return psVar3;
  }
  if (sVar2 == 1) {
    psVar3 = sexp_bignum_fxmul(ctx,dst,a,(b->value).string.length,0);
  }
  else {
    local_a8 = &local_d0;
    pppsStack_80 = &local_a8;
    psStack_a0 = (ctx->value).context.saves;
    local_88 = &local_d8;
    pppsStack_90 = &local_88;
    local_38 = &local_98;
    local_40 = &local_e0;
    local_50.next = (sexp_gc_var_t *)&local_40;
    local_60.next = &local_50;
    local_60.var = &local_c0;
    local_70.next = &local_60;
    local_70.var = &local_c8;
    (ctx->value).context.saves = &local_70;
    k = sVar2 >> 1;
    local_b0 = k;
    local_98 = &local_b8;
    local_50.var = &local_e8;
    sexp_bignum_split(ctx,a,k,local_a8,local_88);
    sexp_bignum_split(ctx,b,k,&local_b8,&local_e0);
    local_e8 = sexp_bignum_add(ctx,(sexp)0x0,local_d8,local_d0);
    local_c0 = sexp_bignum_add(ctx,(sexp)0x0,local_e0,local_b8);
    local_c0 = sexp_bignum_mul(ctx,(sexp)0x0,local_c0,local_e8);
    local_e8 = sexp_bignum_mul(ctx,(sexp)0x0,local_d0,local_b8);
    local_c8 = sexp_bignum_mul(ctx,(sexp)0x0,local_d8,local_e0);
    local_c0 = sexp_bignum_sub(ctx,(sexp)0x0,local_c0,local_e8);
    local_c0 = sexp_bignum_sub(ctx,(sexp)0x0,local_c0,local_c8);
    local_c8 = sexp_bignum_shift(ctx,local_c8,sVar2 & 0xfffffffffffffffe);
    local_c0 = sexp_bignum_shift(ctx,local_c0,local_b0);
    local_c0 = sexp_bignum_add(ctx,local_c0,local_c0,local_e8);
    psVar3 = sexp_bignum_add(ctx,local_c0,local_c0,local_c8);
    (ctx->value).context.saves = psStack_a0;
  }
  (psVar3->value).flonum_bits[0] = (b->value).flonum_bits[0] * (a->value).flonum_bits[0];
  return psVar3;
}

Assistant:

sexp sexp_bignum_mul (sexp ctx, sexp dst, sexp a, sexp b) {
  sexp_uint_t alen=sexp_bignum_hi(a), blen=sexp_bignum_hi(b), k,
    *bdata=sexp_bignum_data(b);
  sexp_gc_var7(a0, a1, b0, b1, z0, z1, z2);
  if (alen < blen) return sexp_bignum_mul(ctx, dst, b, a);
  if (blen == 1) {
    z1 = sexp_bignum_fxmul(ctx, dst, a, bdata[0], 0);
  } else {
    /* karatsuba:                             */
    /*   ab = (a1B^k + a0) * (b1B^k + b0)     */
    /*      = z2B^2k + z1B^k + z0             */
    /* where:                                 */
    /*   z2 = a1b1                            */
    /*   z1 = a1b0 + a0b1                     */
    /*   z0 = a0b0                            */
    /* then optimize further:                 */
    /*   z1 = (a1 + a0)(b1 + b0) - z2 - z0    */
    sexp_gc_preserve7(ctx, a0, a1, b0, b1, z0, z1, z2);
    k = blen / 2;
    sexp_bignum_split(ctx, a, k, &a0, &a1);
    sexp_bignum_split(ctx, b, k, &b0, &b1);
    z0 = sexp_bignum_add(ctx, NULL, a1, a0);  /* temp */
    z1 = sexp_bignum_add(ctx, NULL, b1, b0);
    z1 = sexp_bignum_mul(ctx, NULL, z1, z0);  /* 1 */
    z0 = sexp_bignum_mul(ctx, NULL, a0, b0);  /* 2 */
    z2 = sexp_bignum_mul(ctx, NULL, a1, b1);  /* 3 */
    z1 = sexp_bignum_sub(ctx, NULL, z1, z0);
    z1 = sexp_bignum_sub(ctx, NULL, z1, z2);
    z2 = sexp_bignum_shift(ctx, z2, 2*k);
    z1 = sexp_bignum_shift(ctx, z1, k);
    z1 = sexp_bignum_add(ctx, z1, z1, z0);
    z1 = sexp_bignum_add(ctx, z1, z1, z2);
    sexp_gc_release7(ctx);
  }
  sexp_bignum_sign(z1) = sexp_bignum_sign(a) * sexp_bignum_sign(b);
  return z1;
}